

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O3

QRect __thiscall QProxyStyle::itemPixmapRect(QProxyStyle *this,QRect *r,int flags,QPixmap *pixmap)

{
  QProxyStylePrivate *this_00;
  QObject *pQVar1;
  QRect QVar2;
  
  this_00 = *(QProxyStylePrivate **)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  QProxyStylePrivate::ensureBaseStyle(this_00);
  pQVar1 = (this_00->baseStyle).wp.value;
  QVar2 = (QRect)(**(code **)(*(long *)pQVar1 + 0x90))(pQVar1,r,flags,pixmap);
  return QVar2;
}

Assistant:

QRect QProxyStyle::itemPixmapRect(const QRect &r, int flags, const QPixmap &pixmap) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->itemPixmapRect(r, flags, pixmap);
}